

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::Json_BorderAgentEncodingDecoding_Test::Json_BorderAgentEncodingDecoding_Test
          (Json_BorderAgentEncodingDecoding_Test *this)

{
  Json_BorderAgentEncodingDecoding_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Json_BorderAgentEncodingDecoding_Test_0047e778
  ;
  return;
}

Assistant:

TEST(Json, BorderAgentEncodingDecoding)
{
    nlohmann::json json;
    BorderAgent    new_val;
    BorderAgent    ba_orig{"1.1.1.1",
                        1,
                        ByteArray{},
                        "",
                        BorderAgent::State{BorderAgent::State::ConnectionMode::kX509Connection,
                                           BorderAgent::State::ThreadInterfaceStatus::kActive,
                                           BorderAgent::State::Availability::kHigh, 0, 0},
                        "net1",
                        0x0101010101010101,
                        "",
                        "",
                        Timestamp{},
                        0,
                        "",
                        ByteArray{},
                        "",
                        0,
                        0,
                        "",
                        0,
                        BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kNetworkNameBit |
                            BorderAgent::kExtendedPanIdBit | BorderAgent::kStateBit};

    BorderAgentToJson(ba_orig, json);

    BorderAgentFromJson(new_val, json);
    EXPECT_TRUE((new_val.mPresentFlags & BorderAgent::kAddrBit) != 0);
    EXPECT_TRUE((new_val.mPresentFlags & BorderAgent::kPortBit) != 0);
    EXPECT_TRUE((new_val.mPresentFlags & BorderAgent::kNetworkNameBit) != 0);
    EXPECT_TRUE((new_val.mPresentFlags & BorderAgent::kExtendedPanIdBit) != 0);
    EXPECT_TRUE((new_val.mPresentFlags & BorderAgent::kStateBit) != 0);
    EXPECT_TRUE(new_val.mAddr == ba_orig.mAddr);
    EXPECT_TRUE(new_val.mPort == ba_orig.mPort);
    EXPECT_TRUE(new_val.mNetworkName == ba_orig.mNetworkName);
    EXPECT_TRUE(new_val.mState == ba_orig.mState);
    EXPECT_TRUE(new_val.mExtendedPanId == ba_orig.mExtendedPanId);
}